

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

bool __thiscall
SListBase<void_*,_Memory::ArenaAllocator,_RealCount>::Prepend
          (SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *this,ArenaAllocator *allocator,
          void **data)

{
  Type_conflict pSVar1;
  SListNode<void*,Memory::ArenaAllocator> *pSVar2;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *alloc;
  SListNode<void*,Memory::ArenaAllocator> *this_00;
  Type_conflict *ppSVar3;
  TrackAllocData local_58;
  SListNode<void*,Memory::ArenaAllocator> *local_30;
  Node *newNode;
  void **data_local;
  ArenaAllocator *allocator_local;
  SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *this_local;
  
  newNode = (Node *)data;
  data_local = (void **)allocator;
  allocator_local = (ArenaAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&SListNode<void*,Memory::ArenaAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
             ,0x13b);
  alloc = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    (&allocator->
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
                     &local_58);
  this_00 = (SListNode<void*,Memory::ArenaAllocator> *)
            new<Memory::ArenaAllocator>(0x10,(ArenaAllocator *)alloc,0x223270);
  SListNode<void*,Memory::ArenaAllocator>::SListNode<void*>(this_00,(void **)newNode);
  if (this_00 != (SListNode<void*,Memory::ArenaAllocator> *)0x0) {
    local_30 = this_00;
    ppSVar3 = SListNodeBase<Memory::ArenaAllocator>::Next
                        (&this->super_SListNodeBase<Memory::ArenaAllocator>);
    pSVar1 = *ppSVar3;
    ppSVar3 = SListNodeBase<Memory::ArenaAllocator>::Next
                        ((SListNodeBase<Memory::ArenaAllocator> *)local_30);
    pSVar2 = local_30;
    *ppSVar3 = pSVar1;
    ppSVar3 = SListNodeBase<Memory::ArenaAllocator>::Next
                        (&this->super_SListNodeBase<Memory::ArenaAllocator>);
    *ppSVar3 = (Type_conflict)pSVar2;
    RealCount::IncrementCount(&this->super_RealCount);
  }
  return this_00 != (SListNode<void*,Memory::ArenaAllocator> *)0x0;
}

Assistant:

bool Prepend(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            newNode->Next() = this->Next();
            this->Next() = newNode;
            this->IncrementCount();
            return true;
        }
        return false;
    }